

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::JsonUnitTestResultPrinter::PrintJsonUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppTVar2;
  bool bVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  pointer ppTVar8;
  pointer ppTVar9;
  TimeInMillis ms;
  TimeInMillis ms_00;
  uint uVar10;
  UnitTestImpl *pUVar11;
  long lVar12;
  undefined1 local_b8 [8];
  string kTestsuites;
  long local_88;
  undefined1 local_78 [8];
  string kIndent;
  string local_50;
  
  local_b8 = (undefined1  [8])&kTestsuites._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"testsuites","");
  local_78 = (undefined1  [8])&kIndent._M_string_length;
  std::__cxx11::string::_M_construct((ulong)local_78,'\x02');
  std::__ostream_insert<char,std::char_traits<char>>(stream,"{\n",2);
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"tests","");
  iVar6 = UnitTestImpl::reportable_test_count(unit_test->impl_);
  OutputJsonKey(stream,(string *)local_b8,&local_50,iVar6,(string *)local_78,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"failures","");
  iVar6 = UnitTestImpl::failed_test_count(unit_test->impl_);
  OutputJsonKey(stream,(string *)local_b8,&local_50,iVar6,(string *)local_78,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"disabled","");
  iVar6 = UnitTestImpl::reportable_disabled_test_count(unit_test->impl_);
  OutputJsonKey(stream,(string *)local_b8,&local_50,iVar6,(string *)local_78,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"errors","");
  OutputJsonKey(stream,(string *)local_b8,&local_50,0,(string *)local_78,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (FLAGS_gtest_shuffle == '\x01') {
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"random_seed","");
    OutputJsonKey(stream,(string *)local_b8,&local_50,unit_test->impl_->random_seed_,
                  (string *)local_78,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"timestamp","");
  FormatEpochTimeInMillisAsRFC3339_abi_cxx11_
            ((string *)((long)&kTestsuites.field_2 + 8),
             (internal *)unit_test->impl_->start_timestamp_,ms);
  kIndent.field_2._8_8_ = stream;
  OutputJsonKey(stream,(string *)local_b8,&local_50,(string *)((long)&kTestsuites.field_2 + 8),
                (string *)local_78,true);
  if ((long *)kTestsuites.field_2._8_8_ != &stack0xffffffffffffff78) {
    operator_delete((void *)kTestsuites.field_2._8_8_,local_88 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"time","");
  FormatTimeInMillisAsDuration_abi_cxx11_
            ((string *)((long)&kTestsuites.field_2 + 8),(internal *)unit_test->impl_->elapsed_time_,
             ms_00);
  OutputJsonKey((ostream *)kIndent.field_2._8_8_,(string *)local_b8,&local_50,
                (string *)((long)&kTestsuites.field_2 + 8),(string *)local_78,false);
  if ((long *)kTestsuites.field_2._8_8_ != &stack0xffffffffffffff78) {
    operator_delete((void *)kTestsuites.field_2._8_8_,local_88 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  TestPropertiesAsJson(&local_50,&unit_test->impl_->ad_hoc_test_result_,(string *)local_78);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)kIndent.field_2._8_8_,local_50._M_dataplus._M_p,
                      local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,",\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"name","");
  kTestsuites.field_2._8_8_ = &stack0xffffffffffffff78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&kTestsuites.field_2 + 8),"AllTests","");
  OutputJsonKey((ostream *)kIndent.field_2._8_8_,(string *)local_b8,&local_50,
                (string *)((long)&kTestsuites.field_2 + 8),(string *)local_78,true);
  if ((long *)kTestsuites.field_2._8_8_ != &stack0xffffffffffffff78) {
    operator_delete((void *)kTestsuites.field_2._8_8_,local_88 + 1);
  }
  uVar4 = kIndent.field_2._8_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)uVar4,(char *)local_78,(long)kIndent._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(char *)local_b8,(long)kTestsuites._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\": [\n",5);
  pUVar11 = unit_test->impl_;
  ppTVar8 = (pUVar11->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  bVar3 = false;
  if (0 < (int)((ulong)((long)(pUVar11->test_suites_).
                              super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar8) >> 3)) {
    lVar12 = 0;
    bVar3 = false;
    do {
      ppTVar9 = (ppTVar8[lVar12]->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppTVar2 = *(pointer *)
                 ((long)&(ppTVar8[lVar12]->test_info_list_).
                         super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                         ._M_impl + 8);
      if (ppTVar9 != ppTVar2) {
        iVar6 = 0;
        do {
          uVar10 = (*ppTVar9)->is_in_another_shard_ ^ 1;
          if ((*ppTVar9)->matches_filter_ == false) {
            uVar10 = 0;
          }
          iVar6 = iVar6 + uVar10;
          ppTVar9 = ppTVar9 + 1;
        } while (ppTVar9 != ppTVar2);
        if (iVar6 != 0) {
          bVar5 = true;
          if (bVar3) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)kIndent.field_2._8_8_,",\n",2);
            bVar5 = bVar3;
          }
          bVar3 = bVar5;
          PrintJsonTestSuite((ostream *)kIndent.field_2._8_8_,
                             (unit_test->impl_->test_suites_).
                             super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar12]);
        }
      }
      lVar12 = lVar12 + 1;
      pUVar11 = unit_test->impl_;
      ppTVar8 = (pUVar11->test_suites_).
                super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (lVar12 < (int)((ulong)((long)(pUVar11->test_suites_).
                                          super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar8
                                   ) >> 3));
  }
  bVar5 = TestResult::Failed(&pUVar11->ad_hoc_test_result_);
  if (bVar5) {
    if (bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)kIndent.field_2._8_8_,",\n",2);
    }
    OutputJsonTestSuiteForTestResult
              ((ostream *)kIndent.field_2._8_8_,&unit_test->impl_->ad_hoc_test_result_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)kIndent.field_2._8_8_,"\n",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)kIndent.field_2._8_8_,(char *)local_78,
                      (long)kIndent._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}\n",2);
  if (local_78 != (undefined1  [8])&kIndent._M_string_length) {
    operator_delete((void *)local_78,kIndent._M_string_length + 1);
  }
  if (local_b8 != (undefined1  [8])&kTestsuites._M_string_length) {
    operator_delete((void *)local_b8,kTestsuites._M_string_length + 1);
  }
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonUnitTest(std::ostream* stream,
                                                  const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";

  OutputJsonKey(stream, kTestsuites, "tests", unit_test.reportable_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "failures", unit_test.failed_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "disabled",
                unit_test.reportable_disabled_test_count(), kIndent);
  OutputJsonKey(stream, kTestsuites, "errors", 0, kIndent);
  if (GTEST_FLAG_GET(shuffle)) {
    OutputJsonKey(stream, kTestsuites, "random_seed", unit_test.random_seed(),
                  kIndent);
  }
  OutputJsonKey(stream, kTestsuites, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(unit_test.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "time",
                FormatTimeInMillisAsDuration(unit_test.elapsed_time()), kIndent,
                false);

  *stream << TestPropertiesAsJson(unit_test.ad_hoc_test_result(), kIndent)
          << ",\n";

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  bool comma = false;
  for (int i = 0; i < unit_test.total_test_suite_count(); ++i) {
    if (unit_test.GetTestSuite(i)->reportable_test_count() > 0) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      PrintJsonTestSuite(stream, *unit_test.GetTestSuite(i));
    }
  }

  // If there was a test failure outside of one of the test suites (like in a
  // test environment) include that in the output.
  if (unit_test.ad_hoc_test_result().Failed()) {
    if (comma) {
      *stream << ",\n";
    }
    OutputJsonTestSuiteForTestResult(stream, unit_test.ad_hoc_test_result());
  }

  *stream << "\n"
          << kIndent << "]\n"
          << "}\n";
}